

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-sl.cpp
# Opt level: O0

bool __thiscall IntVarSL::remVal(IntVarSL *this,int64_t v,Reason r,bool channel)

{
  int iVar1;
  uint uVar2;
  undefined1 in_CL;
  undefined8 in_RDX;
  Tint *in_RSI;
  IntVarSL *in_RDI;
  bool bVar3;
  int u;
  undefined3 in_stack_ffffffffffffffdc;
  uint o;
  
  o = CONCAT13(in_CL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  iVar1 = find_index(in_RDI,(int)((ulong)in_RSI >> 0x20),(RoundMode)in_RSI);
  uVar2 = (*(in_RDI->el->super_IntVar).super_Var.super_Branching._vptr_Branching[0x11])
                    (in_RDI->el,(long)iVar1,in_RDX,(ulong)((byte)(o >> 0x18) & 1));
  bVar3 = (uVar2 & 1) != 0;
  if (bVar3) {
    Tchar::operator=((Tchar *)in_RSI,(char)(o >> 0x18));
    uVar2 = Tint::operator_cast_to_int(&(in_RDI->el->super_IntVar).min);
    vec<int>::operator[](&in_RDI->values,uVar2);
    Tint::operator=(in_RSI,o);
    uVar2 = Tint::operator_cast_to_int(&(in_RDI->el->super_IntVar).max);
    vec<int>::operator[](&in_RDI->values,uVar2);
    Tint::operator=(in_RSI,o);
  }
  return bVar3;
}

Assistant:

bool IntVarSL::remVal(int64_t v, Reason r, bool channel) {
	assert(remValNotR(v));
	const int u = find_index(static_cast<int>(v), ROUND_NONE);
	assert(u != -1);
	if (!el->remVal(u, r, channel)) {
		return false;
	}
	vals[v] = 0;
	min = values[el->min];
	max = values[el->max];
	return true;
}